

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinR2SCANL_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  ulong uVar1;
  double dVar2;
  double sigma_00;
  double tau_00;
  double rho_00;
  double vl;
  double e;
  double vlapl_k;
  double vsigma_k;
  double vrho_k;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  const_host_buffer_type local_60;
  const_host_buffer_type local_58;
  const_host_buffer_type local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    local_68 = scal_fact * 0.0;
    uVar1 = 0;
    local_a0 = scal_fact;
    local_60 = rho;
    local_58 = sigma;
    local_50 = lapl;
    do {
      local_40 = local_50[uVar1];
      rho_00 = local_60[uVar1];
      local_48 = local_58[uVar1];
      if (rho_00 <= 1e-15) {
        local_a8 = 0.0;
        local_78 = 0.0;
        local_80 = 0.0;
        local_88 = 0.0;
        local_38 = 0.0;
      }
      else {
        dVar2 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= local_48) {
          dVar2 = local_48;
        }
        local_70 = rho_00;
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_unpolar_impl
                  (rho_00,dVar2,local_40,0.0,&local_a8,&local_78,&local_80,&local_88,&local_38);
        rho_00 = local_70;
      }
      local_a8 = local_a8 * rho_00;
      if (rho_00 <= 1e-11) {
        local_90 = 0.0;
        local_b0 = 0.0;
        local_b8 = 0.0;
        local_c0 = 0.0;
      }
      else {
        dVar2 = 4.641588833612795e-30;
        if (4.641588833612795e-30 <= local_48) {
          dVar2 = local_48;
        }
        tau_00 = 1e-20;
        if (1e-20 <= local_a8) {
          tau_00 = local_a8;
        }
        sigma_00 = rho_00 * 8.0 * tau_00;
        if (dVar2 <= sigma_00) {
          sigma_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_vxc_unpolar_impl
                  (rho_00,sigma_00,local_40,tau_00,&local_90,&local_b0,&local_b8,&local_98,&local_c0
                  );
      }
      local_b0 = local_78 * local_c0 + local_b0;
      local_b8 = local_80 * local_c0 + local_b8;
      local_98 = local_c0 * local_88;
      local_c0 = 0.0;
      eps[uVar1] = local_90 * local_a0 + eps[uVar1];
      vrho[uVar1] = local_b0 * local_a0 + vrho[uVar1];
      vsigma[uVar1] = local_b8 * local_a0 + vsigma[uVar1];
      vtau[uVar1] = vtau[uVar1] + local_68;
      vlapl[uVar1] = local_98 * local_a0 + vlapl[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}